

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  ContextOptions *pCVar2;
  byte bVar3;
  String local_30;
  
  EVar1 = *this;
  bVar3 = (byte)this[5] ^ (byte)EVar1;
  if ((bVar3 & 1) != 0) {
    pCVar2 = getContextOptions();
    if (pCVar2->success != true) {
      String::String(&local_30);
      Result::Result(__return_storage_ptr__,true,&local_30);
      goto LAB_0011d85d;
    }
    EVar1 = *this;
  }
  doctest::toString(&local_30,(bool)((byte)EVar1 & 1));
  Result::Result(__return_storage_ptr__,(bool)(bVar3 & 1),&local_30);
LAB_0011d85d:
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }